

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::dump
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *os,basic_json_encode_options<char> *options,
          indenting indent)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  error_code ec;
  indenting in_stack_ffffffffffffffaf;
  basic_json_encode_options<char> *in_stack_ffffffffffffffb0;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  error_category *in_stack_ffffffffffffffd0;
  ser_error *psStack_28;
  
  std::error_code::error_code(in_RDI);
  dump(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
       in_stack_ffffffffffffffaf,in_RDI);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = in_stack_ffffffffffffffd0;
  ec_00._0_8_ = in_stack_ffffffffffffffc8;
  ser_error::ser_error(psStack_28,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void dump(std::basic_ostream<char_type>& os, 
            const basic_json_encode_options<char_type>& options = basic_json_options<CharT>(),
            indenting indent = indenting::no_indent) const
        {
            std::error_code ec;
            dump(os, options, indent, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec));
            }
        }